

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist.hpp
# Opt level: O0

vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *
cast<float,std::byte,784ul>
          (vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_> *i)

{
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
  bVar3;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *in_RDI;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *c;
  vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
  *in_stack_ffffffffffffff98;
  
  pico_tree::std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>::
  vector((vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_> *)0x104e25);
  cVar1 = pico_tree::std::
          vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::
          begin((vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                 *)in_stack_ffffffffffffff98);
  cVar2 = pico_tree::std::
          vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::end
                    ((vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                      *)in_stack_ffffffffffffff98);
  bVar3 = std::
          back_inserter<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>
                    (in_stack_ffffffffffffff98);
  std::
  transform<__gnu_cxx::__normal_iterator<std::array<std::byte,784ul>const*,std::vector<std::array<std::byte,784ul>,std::allocator<std::array<std::byte,784ul>>>>,std::back_insert_iterator<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>,cast<float,std::byte,784ul>(std::vector<std::array<std::byte,784ul>,std::allocator<std::array<std::byte,784ul>>>const&)::_lambda(std::array<std::byte,784ul>const&)_1_>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  return in_RDI;
}

Assistant:

std::vector<std::array<U_, N_>> cast(std::vector<std::array<T_, N_>> const& i) {
  std::vector<std::array<U_, N_>> c;
  std::transform(
      i.begin(),
      i.end(),
      std::back_inserter(c),
      [](std::array<T_, N_> const& a) -> std::array<U_, N_> {
        return cast<U_>(a);
      });
  return c;
}